

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_info_hdu(fitsfile *infptr)

{
  int iVar1;
  undefined1 local_350 [8];
  unsigned_long hdusum;
  unsigned_long datasum;
  int ii;
  int stat;
  int hdupos;
  int bitpix;
  int hdutype;
  int naxis;
  char com [81];
  undefined1 local_2c8;
  char acStack_2c7 [7];
  char val [81];
  char local_268 [8];
  char msg [513];
  long local_58;
  long naxes [9];
  fitsfile *infptr_local;
  
  naxes[8] = (long)infptr;
  memcpy(&local_58,&DAT_0010c170,0x48);
  bitpix = 0;
  datasum._4_4_ = 0;
  ffmahd(naxes[8],1,0,(long)&datasum + 4);
  if (datasum._4_4_ != 0) {
    fp_abort_output((fitsfile *)naxes[8],(fitsfile *)0x0,datasum._4_4_);
  }
  ii = 1;
  while (datasum._4_4_ == 0) {
    ffghdt(naxes[8],&hdupos,(long)&datasum + 4);
    if (datasum._4_4_ != 0) {
      fp_abort_output((fitsfile *)naxes[8],(fitsfile *)0x0,datasum._4_4_);
    }
    ffgkey(naxes[8],"XTENSION",&local_2c8,&hdutype,(long)&datasum + 4);
    if (datasum._4_4_ == 0xca) {
      datasum._4_4_ = 0;
    }
    else if (datasum._4_4_ == 0) {
      if (((hdupos == 0) && (iVar1 = strncmp(acStack_2c7,"IMAGE",5), iVar1 != 0)) &&
         (iVar1 = strncmp(acStack_2c7,"BINTABLE",5), iVar1 != 0)) {
        hdupos = 3;
      }
    }
    else {
      fp_abort_output((fitsfile *)naxes[8],(fitsfile *)0x0,datasum._4_4_);
    }
    ffgcks(naxes[8],&hdusum,local_350,(long)&datasum + 4);
    if (hdupos == 0) {
      snprintf(local_268,0x201,"  %d IMAGE",(ulong)(uint)ii);
      fp_msg(local_268);
      snprintf(local_268,0x201," SUMS=%lu/%lu",(long)(int)(local_350._0_4_ ^ 0xffffffff),hdusum);
      fp_msg(local_268);
      ffgipr(naxes[8],9,&stat,&bitpix,&local_58,(long)&datasum + 4);
      snprintf(local_268,0x201," BITPIX=%d",(ulong)(uint)stat);
      fp_msg(local_268);
      if (bitpix == 0) {
        snprintf(local_268,0x201," [no_pixels]");
        fp_msg(local_268);
      }
      else if (bitpix == 1) {
        snprintf(local_268,0x201," [%ld]",naxes[0]);
        fp_msg(local_268);
      }
      else {
        snprintf(local_268,0x201," [%ld",local_58);
        fp_msg(local_268);
        for (datasum._0_4_ = 1; (int)datasum < bitpix; datasum._0_4_ = (int)datasum + 1) {
          snprintf(local_268,0x201,"x%ld",naxes[(long)(int)datasum + -1]);
          fp_msg(local_268);
        }
        fp_msg("]");
      }
      iVar1 = fits_is_compressed_image(naxes[8],(long)&datasum + 4);
      if (iVar1 == 0) {
        fp_msg(" not_tiled\n");
      }
      else {
        ffgkey(naxes[8],"ZCMPTYPE",&local_2c8,&hdutype,(long)&datasum + 4);
        iVar1 = strncmp(acStack_2c7,"RICE_1",6);
        if (iVar1 == 0) {
          fp_msg(" tiled_rice\n");
        }
        else {
          iVar1 = strncmp(acStack_2c7,"GZIP_1",6);
          if (iVar1 == 0) {
            fp_msg(" tiled_gzip_1\n");
          }
          else {
            iVar1 = strncmp(acStack_2c7,"GZIP_2",6);
            if (iVar1 == 0) {
              fp_msg(" tiled_gzip_2\n");
            }
            else {
              iVar1 = strncmp(acStack_2c7,"PLIO_1",6);
              if (iVar1 == 0) {
                fp_msg(" tiled_plio\n");
              }
              else {
                iVar1 = strncmp(acStack_2c7,"HCOMPRESS_1",0xb);
                if (iVar1 == 0) {
                  fp_msg(" tiled_hcompress\n");
                }
                else {
                  fp_msg(" unknown\n");
                }
              }
            }
          }
        }
      }
    }
    else if (hdupos == 1) {
      snprintf(local_268,0x201,"  %d ASCII_TBL",(ulong)(uint)ii);
      fp_msg(local_268);
      snprintf(local_268,0x201," SUMS=%lu/%lu\n",(long)(int)(local_350._0_4_ ^ 0xffffffff),hdusum);
      fp_msg(local_268);
    }
    else if (hdupos == 2) {
      snprintf(local_268,0x201,"  %d BINARY_TBL",(ulong)(uint)ii);
      fp_msg(local_268);
      snprintf(local_268,0x201," SUMS=%lu/%lu\n",(long)(int)(local_350._0_4_ ^ 0xffffffff),hdusum);
      fp_msg(local_268);
    }
    else {
      snprintf(local_268,0x201,"  %d OTHER",(ulong)(uint)ii);
      fp_msg(local_268);
      snprintf(local_268,0x201," SUMS=%lu/%lu",(long)(int)(local_350._0_4_ ^ 0xffffffff),hdusum);
      fp_msg(local_268);
      snprintf(local_268,0x201," %s\n",&local_2c8);
      fp_msg(local_268);
    }
    ffmrhd(naxes[8],1,0,(long)&datasum + 4);
    ii = ii + 1;
  }
  return 0;
}

Assistant:

int fp_info_hdu (fitsfile *infptr)
{
	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	char	msg[SZ_STR], val[SZ_CARD], com[SZ_CARD];
        int     naxis=0, hdutype, bitpix, hdupos, stat=0, ii;
        unsigned long   datasum, hdusum;

	fits_movabs_hdu (infptr, 1, NULL, &stat);
	if (stat) { 
	    fp_abort_output(infptr, NULL, stat);
	}

	for (hdupos=1; ! stat; hdupos++) {
	    fits_get_hdu_type (infptr, &hdutype, &stat);
	    if (stat) { 
	        fp_abort_output(infptr, NULL, stat);
	    }

	    /* fits_get_hdu_type calls unknown extensions "IMAGE_HDU"
	     * so consult XTENSION keyword itself
	     */
	    fits_read_keyword (infptr, "XTENSION", val, com, &stat);
	    if (stat == KEY_NO_EXIST) {
		/* in primary HDU which by definition is an "image" */
		stat=0; /* clear for later error handling */

	    } else if (stat) {
	        fp_abort_output(infptr, NULL, stat);

	    } else if (hdutype == IMAGE_HDU) {
		/* that is, if XTENSION != "IMAGE" AND != "BINTABLE" */
		if (strncmp (val+1, "IMAGE", 5) &&
		    strncmp (val+1, "BINTABLE", 5)) {

		     /* assign something other than any of these */
		    hdutype = IMAGE_HDU + ASCII_TBL + BINARY_TBL;
		}
	    }

            fits_get_chksum(infptr, &datasum, &hdusum, &stat);

	    if (hdutype == IMAGE_HDU) {
		snprintf (msg, SZ_STR,"  %d IMAGE", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

		fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, &stat);

                snprintf (msg, SZ_STR," BITPIX=%d", bitpix); fp_msg (msg);

		if (naxis == 0) {
                    snprintf (msg, SZ_STR," [no_pixels]"); fp_msg (msg);
		} else if (naxis == 1) {
		    snprintf (msg, SZ_STR," [%ld]", naxes[1]); fp_msg (msg);
		} else {
		    snprintf (msg, SZ_STR," [%ld", naxes[0]); fp_msg (msg);
		    for (ii=1; ii < naxis; ii++) {
			snprintf (msg, SZ_STR,"x%ld", naxes[ii]); fp_msg (msg);
		    }
		    fp_msg ("]");
		}

                if (fits_is_compressed_image (infptr, &stat)) {
                    fits_read_keyword (infptr, "ZCMPTYPE", val, com, &stat);

                    /* allow for quote in keyword value */
                    if (! strncmp (val+1, "RICE_1", 6))
                        fp_msg (" tiled_rice\n");
                    else if (! strncmp (val+1, "GZIP_1", 6))
                        fp_msg (" tiled_gzip_1\n");
                    else if (! strncmp (val+1, "GZIP_2", 6))
                        fp_msg (" tiled_gzip_2\n");
                    else if (! strncmp (val+1, "PLIO_1", 6))
                        fp_msg (" tiled_plio\n");
                    else if (! strncmp (val+1, "HCOMPRESS_1", 11))
                        fp_msg (" tiled_hcompress\n");
                    else
                        fp_msg (" unknown\n");

                } else
                    fp_msg (" not_tiled\n");

            } else if (hdutype == ASCII_TBL) {
                snprintf (msg, SZ_STR,"  %d ASCII_TBL", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu\n", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

            } else if (hdutype == BINARY_TBL) {
                snprintf (msg, SZ_STR,"  %d BINARY_TBL", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu\n", (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);

            } else {
                snprintf (msg, SZ_STR,"  %d OTHER", hdupos); fp_msg (msg);
                snprintf (msg, SZ_STR," SUMS=%lu/%lu",   (unsigned long) (~((int) hdusum)), datasum); fp_msg (msg);
                snprintf (msg, SZ_STR," %s\n", val); fp_msg (msg);
            }

	    fits_movrel_hdu (infptr, 1, NULL, &stat);
	}
	return(0);
}